

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O0

int __thiscall booster::aio::basic_io_device::close(basic_io_device *this,int __fd)

{
  error_code eVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined8 uVar3;
  error_code e;
  system_error *in_stack_ffffffffffffffd0;
  error_code local_18;
  basic_io_device *local_8;
  
  local_8 = this;
  std::error_code::error_code((error_code *)this);
  close(this,(int)&local_18);
  bVar2 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar2) {
    return (int)CONCAT71(extraout_var,bVar2);
  }
  uVar3 = __cxa_allocate_exception(0x40);
  eVar1._M_cat = local_18._M_cat;
  eVar1._M_value = local_18._M_value;
  eVar1._4_4_ = local_18._4_4_;
  system::system_error::system_error(in_stack_ffffffffffffffd0,eVar1);
  __cxa_throw(uVar3,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_io_device::close()
{
	system::error_code e;
	close(e);
	if(e)
		throw system::system_error(e);
}